

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  const_iterator cVar3;
  ostream *poVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  string val;
  long local_a8;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  long *local_98;
  string local_90;
  string local_70;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  if (name->_M_string_length == 0) {
    local_70._M_dataplus._M_p = (pointer)0x36;
    local_70._M_string_length = 0x8dacbd;
    local_70.field_2._M_allocated_capacity = 0;
    local_50 = (long *)(comment->_M_dataplus)._M_p;
    local_70.field_2._8_8_ = comment->_M_string_length;
    local_48 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_70;
    cmCatViews(&local_90,views);
    cmSystemTools::Error(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    if ((WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
         ::variablesShouldNotBeTrimmed_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                                     ::variablesShouldNotBeTrimmed_abi_cxx11_), iVar2 != 0)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CODE_CHECK","");
      local_98 = local_40;
      local_50 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LAUNCHER","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                     ::variablesShouldNotBeTrimmed_abi_cxx11_,&local_70,&stack0xffffffffffffffd0,0,
                 &local_99,&local_9a,&local_9b);
      local_a8 = -0x40;
      do {
        if (local_98 != (long *)local_98[-2]) {
          operator_delete((long *)local_98[-2],*local_98 + 1);
        }
        local_98 = local_98 + -4;
        local_a8 = local_a8 + 0x20;
      } while (local_a8 != 0);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                    ::variablesShouldNotBeTrimmed_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                           ::variablesShouldNotBeTrimmed_abi_cxx11_);
    }
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                    ::variablesShouldNotBeTrimmed_abi_cxx11_._M_h,name);
    if (cVar3.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      str._M_str = (value->_M_dataplus)._M_p;
      str._M_len = value->_M_string_length;
      cmTrimWhitespace_abi_cxx11_(&local_70,str);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    if (local_90._M_string_length != 0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                           local_90.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error(cmStrCat("No name given for WriteVariable! called "
                                  "with comment: ",
                                  comment));
    return;
  }

  std::string val;
  static std::unordered_set<std::string> const variablesShouldNotBeTrimmed = {
    "CODE_CHECK", "LAUNCHER"
  };
  if (variablesShouldNotBeTrimmed.find(name) ==
      variablesShouldNotBeTrimmed.end()) {
    val = cmTrimWhitespace(value);
  } else {
    val = value;
  }

  // Do not add a variable if the value is empty.
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}